

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O2

void http_parser_init(http_parser *parser,http_parser_type t)

{
  http_parser_type hVar1;
  
  *(undefined8 *)parser = 0;
  parser->content_length = 0;
  parser->http_major = 0;
  parser->http_minor = 0;
  *(undefined4 *)&parser->field_0x14 = 0;
  hVar1 = 0x2400;
  if (t != HTTP_REQUEST) {
    hVar1 = (uint)(t == HTTP_RESPONSE) * 0x400 + 0x400;
  }
  *(http_parser_type *)parser = hVar1 | t & (HTTP_BOTH|HTTP_RESPONSE);
  return;
}

Assistant:

void
http_parser_init (http_parser *parser, enum http_parser_type t)
{
  void *data = parser->data; /* preserve application data */
  memset(parser, 0, sizeof(*parser));
  parser->data = data;
  parser->type = t;
  parser->state = (t == HTTP_REQUEST ? s_start_req : (t == HTTP_RESPONSE ? s_start_res : s_start_req_or_res));
  parser->http_errno = HPE_OK;
}